

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O1

void altar_wrath(int x,int y)

{
  aligntyp alignment;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *__s2;
  
  uVar1 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 7;
  if (uVar1 == 0) {
    alignment = -0x80;
  }
  else if (uVar1 == 4) {
    alignment = '\x01';
  }
  else {
    alignment = (char)uVar1 + -2;
  }
  pcVar3 = align_gname(alignment);
  __s2 = align_gname(u.ualign.type);
  iVar2 = strcmp(pcVar3,__s2);
  if (iVar2 != 0) {
    pcVar3 = align_gname(alignment);
    pline("A voice (could it be %s?) whispers:",pcVar3);
    verbalize("Thou shalt pay, infidel!");
    change_luck(-1);
    return;
  }
  godvoice(alignment,"How darest thou desecrate my altar!");
  adjattrib(2,-1,'\0',0);
  return;
}

Assistant:

void altar_wrath(int x, int y)
{
    aligntyp altaralign = a_align(x,y);

    if (!strcmp(align_gname(altaralign), u_gname())) {
	godvoice(altaralign, "How darest thou desecrate my altar!");
	adjattrib(A_WIS, -1, FALSE, 0);
    } else {
	pline("A voice (could it be %s?) whispers:",
	      align_gname(altaralign));
	verbalize("Thou shalt pay, infidel!");
	change_luck(-1);
    }
}